

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

void rec_func_vararg(jit_State *J)

{
  GCproto *pGVar1;
  TRef *pTVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  pGVar1 = J->pt;
  uVar4 = J->maxslot;
  uVar3 = uVar4 + 2;
  if ((uint)pGVar1->framesize + J->baseslot + uVar3 < 0xfa) {
    pTVar2 = J->base;
    pTVar2[uVar4] = pTVar2[-2];
    pTVar2[uVar4 + 1] = 0x10000;
    uVar4 = (uint)pGVar1->numparams;
    if (J->maxslot < uVar4) {
      uVar4 = J->maxslot;
    }
    if (uVar4 != 0) {
      uVar5 = 0;
      do {
        pTVar2[uVar3 + (int)uVar5] = pTVar2[uVar5];
        pTVar2[uVar5] = 0x7fff;
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    J->maxslot = uVar4;
    J->framedepth = J->framedepth + 1;
    J->base = pTVar2 + uVar3;
    J->baseslot = J->baseslot + uVar3;
    return;
  }
  lj_trace_err(J,LJ_TRERR_STACKOV);
}

Assistant:

static void rec_func_vararg(jit_State *J)
{
  GCproto *pt = J->pt;
  BCReg s, fixargs, vframe = J->maxslot+1+LJ_FR2;
  lj_assertJ((pt->flags & PROTO_VARARG), "FUNCV in non-vararg function");
  if (J->baseslot + vframe + pt->framesize >= LJ_MAX_JSLOTS)
    lj_trace_err(J, LJ_TRERR_STACKOV);
  J->base[vframe-1-LJ_FR2] = J->base[-1-LJ_FR2];  /* Copy function up. */
#if LJ_FR2
  J->base[vframe-1] = TREF_FRAME;
#endif
  /* Copy fixarg slots up and set their original slots to nil. */
  fixargs = pt->numparams < J->maxslot ? pt->numparams : J->maxslot;
  for (s = 0; s < fixargs; s++) {
    J->base[vframe+s] = J->base[s];
    J->base[s] = TREF_NIL;
  }
  J->maxslot = fixargs;
  J->framedepth++;
  J->base += vframe;
  J->baseslot += vframe;
}